

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

int __thiscall glslang::TShaderQualifiers::init(TShaderQualifiers *this,EVP_PKEY_CTX *ctx)

{
  this->geometry = ElgNone;
  this->pixelCenterInteger = false;
  this->originUpperLeft = false;
  this->invocations = -1;
  this->vertices = -1;
  this->spacing = EvsNone;
  this->order = EvoNone;
  this->pointMode = false;
  this->localSize[0] = 1;
  this->localSize[1] = 1;
  this->localSize[2] = 1;
  this->localSizeNotDefault[0] = false;
  this->localSizeNotDefault[1] = false;
  this->localSizeNotDefault[2] = false;
  this->localSizeSpecId[0] = -1;
  this->localSizeSpecId[1] = -1;
  *(undefined8 *)(this->localSizeSpecId + 2) = 0xffffffff;
  this->nonCoherentDepthAttachmentReadEXT = false;
  this->nonCoherentStencilAttachmentReadEXT = false;
  this->layoutDepth = EldNone;
  this->layoutStencil = ElsNone;
  this->blendEquation = false;
  this->numViews = -1;
  this->layoutOverrideCoverage = false;
  this->layoutDerivativeGroupQuads = false;
  this->layoutDerivativeGroupLinear = false;
  this->layoutPrimitiveCulling = false;
  this->primitives = -1;
  this->interlockOrdering = EioNone;
  return 0;
}

Assistant:

void init()
    {
        geometry = ElgNone;
        originUpperLeft = false;
        pixelCenterInteger = false;
        invocations = TQualifier::layoutNotSet;
        vertices = TQualifier::layoutNotSet;
        spacing = EvsNone;
        order = EvoNone;
        pointMode = false;
        localSize[0] = 1;
        localSize[1] = 1;
        localSize[2] = 1;
        localSizeNotDefault[0] = false;
        localSizeNotDefault[1] = false;
        localSizeNotDefault[2] = false;
        localSizeSpecId[0] = TQualifier::layoutNotSet;
        localSizeSpecId[1] = TQualifier::layoutNotSet;
        localSizeSpecId[2] = TQualifier::layoutNotSet;
        earlyFragmentTests = false;
        earlyAndLateFragmentTestsAMD = false;
        postDepthCoverage = false;
        nonCoherentColorAttachmentReadEXT = false;
        nonCoherentDepthAttachmentReadEXT = false;
        nonCoherentStencilAttachmentReadEXT = false;
        layoutDepth = EldNone;
        layoutStencil = ElsNone;
        blendEquation = false;
        numViews = TQualifier::layoutNotSet;
        layoutOverrideCoverage      = false;
        layoutDerivativeGroupQuads  = false;
        layoutDerivativeGroupLinear = false;
        layoutPrimitiveCulling      = false;
        primitives                  = TQualifier::layoutNotSet;
        interlockOrdering = EioNone;
    }